

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsplit.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  __node_base _Var5;
  _Alloc_hider _Var6;
  size_type sVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  ostream *poVar11;
  istream *piVar12;
  long lVar13;
  undefined8 extraout_RAX;
  pointer pbVar14;
  size_type sVar15;
  pointer pbVar16;
  ulong uVar17;
  __hash_code __code;
  _Hash_node_base *p_Var18;
  ulong uVar19;
  ostream *poVar20;
  bool bVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> infile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  infiles;
  string outfilename;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  bad;
  string suffix;
  string prefix;
  stringstream ss;
  ifstream infile_1;
  ofstream outfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_738;
  long local_720;
  value_type local_718;
  char *local_6f8;
  long local_6f0;
  char local_6e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6d8;
  undefined1 *local_6b8 [2];
  undefined1 local_6a8 [16];
  pointer local_698;
  pointer local_690;
  undefined8 local_688;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_680;
  char *local_678 [2];
  char local_668 [16];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_658;
  char *local_620;
  long local_618;
  char local_610 [16];
  char *local_600;
  long local_5f8;
  char local_5f0 [16];
  char *local_5e0;
  long local_5d8;
  char local_5d0 [16];
  long local_5c0 [2];
  ostream local_5b0 [112];
  ios_base local_540 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [16];
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  local_6d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < argc) {
    uVar17 = 1;
    bVar8 = false;
    do {
      __s1 = argv[uVar17];
      if (*__s1 == '-') {
        if ((__s1[1] == 'v') && (__s1[2] == '\0')) {
          s_verbosity = s_verbosity + 1;
        }
        else {
          if ((__s1[1] != 'f') || (__s1[2] != '\0')) {
            if ((__s1[1] != 'h') || (__s1[2] != '\0')) goto LAB_001034a2;
            goto LAB_00103514;
          }
          bVar8 = true;
        }
      }
      else {
LAB_001034a2:
        iVar10 = strcmp(__s1,"--help");
        if (iVar10 == 0) {
LAB_00103514:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage:",6);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  btorsplit [options] BTOR2_FILE...\n",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Options:",8);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  -h,--help   Print this help and exit.",0x27);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  -v          Increase verbosity.",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "  -f          Overwrite output file if it already exists.",0x39);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Split multi-property BTOR2 files into single property files. For each\nproperty a new file \'<basename>p[0-9]+.btor is generated"
                     ,0x7e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          goto LAB_00103f02;
        }
        std::__cxx11::string::string((string *)local_438,__s1,(allocator *)local_230);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_6d8,
                   local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
          operator_delete(local_438[0]._M_dataplus._M_p);
        }
      }
      uVar17 = uVar17 + 1;
    } while ((uint)argc != uVar17);
    if (local_6d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_6d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_698 = local_6d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_6d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_6d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_680 = _VTT;
        local_688 = __filebuf;
        pbVar14 = local_6d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_6f8 = local_6e8;
          pcVar1 = (pbVar14->_M_dataplus)._M_p;
          local_690 = pbVar14;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6f8,pcVar1,pcVar1 + pbVar14->_M_string_length);
          if (s_verbosity != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Processing ",0xb);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_6f8,local_6f0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
          local_6b8[0] = local_6a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6b8,local_6f8,local_6f8 + local_6f0);
          std::ifstream::ifstream(local_438,(string *)local_6b8,_S_in);
          local_738.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_738.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_738.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_658._M_buckets = &local_658._M_single_bucket;
          local_658._M_bucket_count = 1;
          local_658._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_658._M_element_count = 0;
          local_658._M_rehash_policy._M_max_load_factor = 1.0;
          local_658._M_rehash_policy._M_next_resize = 0;
          local_658._M_single_bucket = (__node_base_ptr)0x0;
          local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
          local_718._M_string_length = 0;
          local_718.field_2._M_local_buf[0] = '\0';
LAB_0010389b:
          cVar9 = std::ios::widen((char)*(undefined8 *)(local_438[0]._M_dataplus._M_p + -0x18) +
                                  (char)local_438);
          piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_438,(string *)&local_718,cVar9);
          sVar7 = local_718._M_string_length;
          _Var6._M_p = local_718._M_dataplus._M_p;
          if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
            if ((local_718._M_string_length != 0) && ((int)*local_718._M_dataplus._M_p - 0x30U < 10)
               ) {
              uVar17 = 0;
              do {
                if (9 < (int)local_718._M_dataplus._M_p[uVar17] - 0x30U) {
                  uVar19 = uVar17;
                  if (uVar17 < local_718._M_string_length) goto LAB_00103917;
                  break;
                }
                uVar17 = uVar17 + 1;
                uVar19 = sVar7;
              } while (local_718._M_string_length != uVar17);
              goto LAB_00103930;
            }
            goto LAB_00103993;
          }
          if (local_658._M_element_count < 2) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found only one property. Nothing to split",0x29);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
          }
          else {
            std::__cxx11::string::rfind((char *)local_6b8,0x10502b,0xffffffffffffffff);
            std::__cxx11::string::substr((ulong)&local_5e0,(ulong)local_6b8);
            std::__cxx11::string::substr((ulong)&local_600,(ulong)local_6b8);
            if (s_verbosity != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found ",6);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," properties in ",0xf);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," lines",6);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
            }
            _Var5._M_nxt = local_658._M_before_begin._M_nxt;
            if (local_658._M_element_count == 0) {
              local_720 = 0;
            }
            else {
              iVar10 = 0;
              sVar15 = local_658._M_element_count;
              do {
                iVar10 = iVar10 + 1;
                bVar21 = 9 < sVar15;
                sVar15 = sVar15 / 10;
              } while (bVar21);
              local_720 = (long)iVar10;
            }
            for (; _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
              p_Var2 = _Var5._M_nxt[1]._M_nxt;
              std::__cxx11::stringstream::stringstream((stringstream *)local_5c0);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (local_5b0,local_5e0,local_5d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"-p",2);
              lVar13 = *(long *)poVar11;
              poVar20 = poVar11 + *(long *)(lVar13 + -0x18);
              if (poVar11[*(long *)(lVar13 + -0x18) + 0xe1] == (ostream)0x0) {
                std::ios::widen((char)poVar20);
                poVar20[0xe1] = (ostream)0x1;
                lVar13 = *(long *)poVar11;
              }
              poVar20[0xe0] = (ostream)0x30;
              *(long *)(poVar11 + *(long *)(lVar13 + -0x18) + 0x10) = local_720;
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_600,local_5f8);
              std::__cxx11::stringbuf::str();
              if ((!bVar8) && (iVar10 = stat(local_678[0],(stat *)local_230), iVar10 != -1)) {
                die("Output file %s already exists. Delete or use -f to overwrite",local_678[0]);
                goto LAB_00103f36;
              }
              std::ofstream::ofstream((stat *)local_230,(string *)local_678,_S_out);
              if (local_738.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_738.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                p_Var18 = (_Hash_node_base *)0x0;
                pbVar14 = local_738.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pbVar16 = local_738.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                do {
                  if (local_658._M_buckets[(ulong)p_Var18 % local_658._M_bucket_count] !=
                      (__node_base_ptr)0x0) {
                    p_Var3 = local_658._M_buckets[(ulong)p_Var18 % local_658._M_bucket_count]->
                             _M_nxt;
                    p_Var4 = p_Var3[1]._M_nxt;
                    while (p_Var18 != p_Var4) {
                      p_Var3 = p_Var3->_M_nxt;
                      if ((p_Var3 == (_Hash_node_base *)0x0) ||
                         (p_Var4 = p_Var3[1]._M_nxt,
                         (ulong)p_Var4 % local_658._M_bucket_count !=
                         (ulong)p_Var18 % local_658._M_bucket_count)) goto LAB_00103cb1;
                    }
                    if (p_Var2 != p_Var18) goto LAB_00103cfd;
                  }
LAB_00103cb1:
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_230,pbVar14[(long)p_Var18]._M_dataplus._M_p,
                                       pbVar14[(long)p_Var18]._M_string_length);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                  std::ostream::put((char)poVar11);
                  std::ostream::flush();
                  pbVar14 = local_738.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar16 = local_738.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
LAB_00103cfd:
                  p_Var18 = (_Hash_node_base *)((long)&p_Var18->_M_nxt + 1);
                } while (p_Var18 < (_Hash_node_base *)((long)pbVar16 - (long)pbVar14 >> 5));
              }
              std::ofstream::close();
              if (s_verbosity != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Generated ",10);
                std::__cxx11::stringbuf::str();
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_620,local_618);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                if (local_620 != local_610) {
                  operator_delete(local_620);
                }
              }
              local_230._0_8_ = local_680;
              *(undefined8 *)(local_230 + *(long *)&local_680[-1]._M_rehash_policy) = local_688;
              std::filebuf::~filebuf((filebuf *)(local_230 + 8));
              std::ios_base::~ios_base(local_138);
              if (local_678[0] != local_668) {
                operator_delete(local_678[0]);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_5c0);
              std::ios_base::~ios_base(local_540);
            }
            if (local_600 != local_5f0) {
              operator_delete(local_600);
            }
            if (local_5e0 != local_5d0) {
              operator_delete(local_5e0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_718._M_dataplus._M_p != &local_718.field_2) {
            operator_delete(local_718._M_dataplus._M_p);
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_658);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_738);
          std::ifstream::~ifstream(local_438);
          if (local_6b8[0] != local_6a8) {
            operator_delete(local_6b8[0]);
          }
          if (local_6f8 != local_6e8) {
            operator_delete(local_6f8);
          }
          pbVar14 = local_690 + 1;
        } while (pbVar14 != local_698);
      }
LAB_00103f02:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_6d8);
      return 0;
    }
  }
LAB_00103f36:
  die("No BTOR2 input file(s) specified.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p);
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_658);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_738);
  std::ifstream::~ifstream(local_438);
  if (local_6b8[0] != local_6a8) {
    operator_delete(local_6b8[0]);
  }
  if (local_6f8 != local_6e8) {
    operator_delete(local_6f8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6d8);
  _Unwind_Resume(extraout_RAX);
  while (uVar17 = uVar17 + 1, uVar19 = sVar7, sVar7 != uVar17) {
LAB_00103917:
    iVar10 = isspace((int)_Var6._M_p[uVar17]);
    uVar19 = uVar17;
    if (iVar10 == 0) break;
  }
LAB_00103930:
  if ((((uVar19 + 3 < sVar7) && (_Var6._M_p[uVar19] == 'b')) && (_Var6._M_p[uVar19 + 1] == 'a')) &&
     ((_Var6._M_p[uVar19 + 2] == 'd' && (iVar10 = isspace((int)_Var6._M_p[uVar19 + 3]), iVar10 != 0)
      ))) {
    local_5c0[0] = (long)local_738.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_738.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_230._0_8_ = &local_658;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_230._0_8_,local_5c0,(stat *)local_230);
  }
LAB_00103993:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_738,&local_718);
  goto LAB_0010389b;
}

Assistant:

int
main(int argc, char *argv[])
{
  bool overwrite = false;
  std::vector<std::string> infiles;

  for (int i = 1; i < argc; ++i)
  {
    if (!strcmp(argv[i], "-v"))
    {
      ++s_verbosity;
    }
    else if (!strcmp(argv[i], "-f"))
    {
      overwrite = true;
    }
    else if (!strcmp(argv[i], "-h") || !strcmp(argv[i], "--help"))
    {
      print_usage();
      return EXIT_SUCCESS;
    }
    else
    {
      infiles.push_back(std::string(argv[i]));
    }
  }

  if (infiles.empty())
  {
    die("No BTOR2 input file(s) specified.");
  }

  for (auto infile : infiles)
  {
    if (s_verbosity) std::cout << "Processing " << infile << std::endl;
    split_file(infile, overwrite);
  }

  return EXIT_SUCCESS;
}